

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O1

Data * Data::smaller(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  iterator __begin1;
  pointer ppDVar6;
  Data *pDVar7;
  
  ppDVar6 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar4 = __dynamic_cast(*ppDVar6,&typeinfo,&Integer::typeinfo,0);
  lVar4 = *(long *)(lVar4 + 0x10);
  lVar5 = __dynamic_cast(ppDVar6[1],&typeinfo,&Integer::typeinfo,0);
  pDVar7 = falseData;
  pDVar3 = trueData;
  lVar5 = *(long *)(lVar5 + 0x10);
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (; ppDVar6 != ppDVar1; ppDVar6 = ppDVar6 + 1) {
    pDVar2 = *ppDVar6;
    if ((pDVar2 != (Data *)0x0) && (pDVar2->cited == 0)) {
      (*pDVar2->_vptr_Data[1])();
    }
  }
  ppDVar6 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar6 != (pointer)0x0) {
    operator_delete(ppDVar6);
  }
  if (lVar4 < lVar5) {
    pDVar7 = pDVar3;
  }
  operator_delete(dataPara);
  return pDVar7;
}

Assistant:

Data *Data::smaller(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0]))->value
        < (dynamic_cast<Integer *>((*dataPara)[1]))->value) {
        result = Data::trueData;
    } else {
        result = Data::falseData;
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}